

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O1

void __thiscall RemoveVCProcessTest::SetUp(RemoveVCProcessTest *this)

{
  bool bVar1;
  RemoveVCProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar2;
  aiMesh *paVar3;
  aiMesh *paVar4;
  aiVector3D *paVar5;
  aiAnimation **ppaVar6;
  aiAnimation *paVar7;
  aiTexture **ppaVar8;
  aiTexture *paVar9;
  aiMaterial **ppaVar10;
  aiMaterial *paVar11;
  aiLight **ppaVar12;
  aiLight *paVar13;
  aiCamera **ppaVar14;
  aiCamera *paVar15;
  char *message;
  AssertionResult gtest_ar;
  char check [10];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_3a [10];
  
  this_00 = (RemoveVCProcess *)operator_new(0x28);
  Assimp::RemoveVCProcess::RemoveVCProcess(this_00);
  this->piProcess = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->pScene = this_01;
  this_01->mNumMeshes = 2;
  ppaVar2 = (aiMesh **)operator_new__(0x10);
  this_01->mMeshes = ppaVar2;
  paVar3 = (aiMesh *)operator_new(0x520);
  paVar3->mPrimitiveTypes = 0;
  paVar3->mNumVertices = 0;
  paVar3->mNumFaces = 0;
  memset(&paVar3->mVertices,0,0xcc);
  paVar3->mBones = (aiBone **)0x0;
  paVar3->mMaterialIndex = 0;
  (paVar3->mName).length = 0;
  (paVar3->mName).data[0] = '\0';
  memset((paVar3->mName).data + 1,0x1b,0x3ff);
  paVar3->mNumAnimMeshes = 0;
  paVar3->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar3->mMethod = 0;
  (paVar3->mAABB).mMin.x = 0.0;
  (paVar3->mAABB).mMin.y = 0.0;
  (paVar3->mAABB).mMin.z = 0.0;
  (paVar3->mAABB).mMax.x = 0.0;
  (paVar3->mAABB).mMax.y = 0.0;
  (paVar3->mAABB).mMax.z = 0.0;
  paVar3->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar3->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar3->mNumUVComponents[0] = 0;
  paVar3->mNumUVComponents[1] = 0;
  paVar3->mNumUVComponents[2] = 0;
  paVar3->mNumUVComponents[3] = 0;
  paVar3->mNumUVComponents[4] = 0;
  paVar3->mNumUVComponents[5] = 0;
  paVar3->mNumUVComponents[6] = 0;
  paVar3->mNumUVComponents[7] = 0;
  paVar3->mColors[0] = (aiColor4D *)0x0;
  paVar3->mColors[1] = (aiColor4D *)0x0;
  paVar3->mColors[2] = (aiColor4D *)0x0;
  paVar3->mColors[3] = (aiColor4D *)0x0;
  paVar3->mColors[4] = (aiColor4D *)0x0;
  paVar3->mColors[5] = (aiColor4D *)0x0;
  paVar3->mColors[6] = (aiColor4D *)0x0;
  paVar3->mColors[7] = (aiColor4D *)0x0;
  *ppaVar2 = paVar3;
  paVar4 = (aiMesh *)operator_new(0x520);
  paVar4->mPrimitiveTypes = 0;
  paVar4->mNumVertices = 0;
  paVar4->mNumFaces = 0;
  memset(&paVar4->mVertices,0,0xcc);
  paVar4->mBones = (aiBone **)0x0;
  paVar4->mMaterialIndex = 0;
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((paVar4->mName).data + 1,0x1b,0x3ff);
  paVar4->mNumAnimMeshes = 0;
  paVar4->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar4->mMethod = 0;
  (paVar4->mAABB).mMin.x = 0.0;
  (paVar4->mAABB).mMin.y = 0.0;
  (paVar4->mAABB).mMin.z = 0.0;
  (paVar4->mAABB).mMax.x = 0.0;
  (paVar4->mAABB).mMax.y = 0.0;
  (paVar4->mAABB).mMax.z = 0.0;
  paVar4->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar4->mNumUVComponents[0] = 0;
  paVar4->mNumUVComponents[1] = 0;
  paVar4->mNumUVComponents[2] = 0;
  paVar4->mNumUVComponents[3] = 0;
  paVar4->mNumUVComponents[4] = 0;
  paVar4->mNumUVComponents[5] = 0;
  paVar4->mNumUVComponents[6] = 0;
  paVar4->mNumUVComponents[7] = 0;
  paVar4->mColors[0] = (aiColor4D *)0x0;
  paVar4->mColors[1] = (aiColor4D *)0x0;
  paVar4->mColors[2] = (aiColor4D *)0x0;
  paVar4->mColors[3] = (aiColor4D *)0x0;
  paVar4->mColors[4] = (aiColor4D *)0x0;
  paVar4->mColors[5] = (aiColor4D *)0x0;
  paVar4->mColors[6] = (aiColor4D *)0x0;
  paVar4->mColors[7] = (aiColor4D *)0x0;
  ppaVar2[1] = paVar4;
  paVar3->mNumVertices = 0x78;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  (*ppaVar2)->mVertices = paVar5;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  (*this->pScene->mMeshes)->mNormals = paVar5;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[0] = paVar5;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[1] = paVar5;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[2] = paVar5;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[3] = paVar5;
  this->pScene->mMeshes[1]->mNumVertices = 0x78;
  paVar5 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar5,0,0x5a0);
  this->pScene->mMeshes[1]->mVertices = paVar5;
  this->pScene->mNumAnimations = 2;
  ppaVar6 = (aiAnimation **)operator_new__(0x10);
  this->pScene->mAnimations = ppaVar6;
  paVar7 = (aiAnimation *)operator_new(0x448);
  (paVar7->mName).length = 0;
  (paVar7->mName).data[0] = '\0';
  memset((paVar7->mName).data + 1,0x1b,0x3ff);
  paVar7->mDuration = -1.0;
  paVar7->mTicksPerSecond = 0.0;
  paVar7->mNumChannels = 0;
  paVar7->mChannels = (aiNodeAnim **)0x0;
  paVar7->mNumMeshChannels = 0;
  paVar7->mMeshChannels = (aiMeshAnim **)0x0;
  paVar7->mNumMorphMeshChannels = 0;
  paVar7->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  *this->pScene->mAnimations = paVar7;
  paVar7 = (aiAnimation *)operator_new(0x448);
  (paVar7->mName).length = 0;
  (paVar7->mName).data[0] = '\0';
  memset((paVar7->mName).data + 1,0x1b,0x3ff);
  paVar7->mDuration = -1.0;
  paVar7->mTicksPerSecond = 0.0;
  paVar7->mNumChannels = 0;
  paVar7->mChannels = (aiNodeAnim **)0x0;
  paVar7->mNumMeshChannels = 0;
  paVar7->mMeshChannels = (aiMeshAnim **)0x0;
  paVar7->mNumMorphMeshChannels = 0;
  paVar7->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  this->pScene->mAnimations[1] = paVar7;
  this->pScene->mNumTextures = 2;
  ppaVar8 = (aiTexture **)operator_new__(0x10);
  this->pScene->mTextures = ppaVar8;
  paVar9 = (aiTexture *)operator_new(0x428);
  paVar9->mWidth = 0;
  paVar9->mHeight = 0;
  paVar9->pcData = (aiTexel *)0x0;
  (paVar9->mFilename).length = 0;
  (paVar9->mFilename).data[0] = '\0';
  memset((paVar9->mFilename).data + 1,0x1b,0x3ff);
  paVar9->achFormatHint[0] = '\0';
  paVar9->achFormatHint[1] = '\0';
  paVar9->achFormatHint[2] = '\0';
  paVar9->achFormatHint[3] = '\0';
  *this->pScene->mTextures = paVar9;
  paVar9 = (aiTexture *)operator_new(0x428);
  paVar9->mWidth = 0;
  paVar9->mHeight = 0;
  paVar9->pcData = (aiTexel *)0x0;
  (paVar9->mFilename).length = 0;
  (paVar9->mFilename).data[0] = '\0';
  memset((paVar9->mFilename).data + 1,0x1b,0x3ff);
  paVar9->achFormatHint[0] = '\0';
  paVar9->achFormatHint[1] = '\0';
  paVar9->achFormatHint[2] = '\0';
  paVar9->achFormatHint[3] = '\0';
  this->pScene->mTextures[1] = paVar9;
  this->pScene->mNumMaterials = 2;
  ppaVar10 = (aiMaterial **)operator_new__(0x10);
  this->pScene->mMaterials = ppaVar10;
  paVar11 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar11);
  *this->pScene->mMaterials = paVar11;
  paVar11 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar11);
  this->pScene->mMaterials[1] = paVar11;
  this->pScene->mNumLights = 2;
  ppaVar12 = (aiLight **)operator_new__(0x10);
  this->pScene->mLights = ppaVar12;
  paVar13 = (aiLight *)operator_new(0x46c);
  (paVar13->mName).length = 0;
  (paVar13->mName).data[0] = '\0';
  memset((paVar13->mName).data + 1,0x1b,0x3ff);
  paVar13->mType = aiLightSource_UNDEFINED;
  (paVar13->mPosition).x = 0.0;
  (paVar13->mPosition).y = 0.0;
  (paVar13->mPosition).z = 0.0;
  (paVar13->mDirection).x = 0.0;
  (paVar13->mDirection).y = 0.0;
  *(undefined8 *)&(paVar13->mDirection).z = 0;
  (paVar13->mUp).x = 0.0;
  (paVar13->mUp).y = 0.0;
  *(undefined8 *)&(paVar13->mUp).z = 0;
  paVar13->mAttenuationLinear = 1.0;
  paVar13->mAttenuationQuadratic = 0.0;
  (paVar13->mColorDiffuse).r = 0.0;
  (paVar13->mColorDiffuse).g = 0.0;
  (paVar13->mColorDiffuse).b = 0.0;
  (paVar13->mColorSpecular).r = 0.0;
  (paVar13->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar13->mColorSpecular).b = 0;
  (paVar13->mColorAmbient).g = 0.0;
  (paVar13->mColorAmbient).b = 0.0;
  paVar13->mAngleInnerCone = 6.2831855;
  paVar13->mAngleOuterCone = 6.2831855;
  (paVar13->mSize).x = 0.0;
  (paVar13->mSize).y = 0.0;
  *this->pScene->mLights = paVar13;
  paVar13 = (aiLight *)operator_new(0x46c);
  (paVar13->mName).length = 0;
  (paVar13->mName).data[0] = '\0';
  memset((paVar13->mName).data + 1,0x1b,0x3ff);
  paVar13->mType = aiLightSource_UNDEFINED;
  (paVar13->mPosition).x = 0.0;
  (paVar13->mPosition).y = 0.0;
  (paVar13->mPosition).z = 0.0;
  (paVar13->mDirection).x = 0.0;
  (paVar13->mDirection).y = 0.0;
  *(undefined8 *)&(paVar13->mDirection).z = 0;
  (paVar13->mUp).x = 0.0;
  (paVar13->mUp).y = 0.0;
  *(undefined8 *)&(paVar13->mUp).z = 0;
  paVar13->mAttenuationLinear = 1.0;
  paVar13->mAttenuationQuadratic = 0.0;
  (paVar13->mColorDiffuse).r = 0.0;
  (paVar13->mColorDiffuse).g = 0.0;
  (paVar13->mColorDiffuse).b = 0.0;
  (paVar13->mColorSpecular).r = 0.0;
  (paVar13->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar13->mColorSpecular).b = 0;
  (paVar13->mColorAmbient).g = 0.0;
  (paVar13->mColorAmbient).b = 0.0;
  paVar13->mAngleInnerCone = 6.2831855;
  paVar13->mAngleOuterCone = 6.2831855;
  (paVar13->mSize).x = 0.0;
  (paVar13->mSize).y = 0.0;
  this->pScene->mLights[1] = paVar13;
  this->pScene->mNumCameras = 2;
  ppaVar14 = (aiCamera **)operator_new__(0x10);
  this->pScene->mCameras = ppaVar14;
  paVar15 = (aiCamera *)operator_new(0x438);
  (paVar15->mName).length = 0;
  (paVar15->mName).data[0] = '\0';
  memset((paVar15->mName).data + 1,0x1b,0x3ff);
  (paVar15->mPosition).x = 0.0;
  (paVar15->mPosition).y = 0.0;
  *(undefined8 *)&(paVar15->mPosition).z = 0;
  (paVar15->mUp).y = 1.0;
  (paVar15->mUp).z = 0.0;
  (paVar15->mLookAt).x = 0.0;
  (paVar15->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar15->mLookAt).z = 0x3f490fdb3f800000;
  paVar15->mClipPlaneNear = 0.1;
  paVar15->mClipPlaneFar = 1000.0;
  paVar15->mAspect = 0.0;
  *this->pScene->mCameras = paVar15;
  paVar15 = (aiCamera *)operator_new(0x438);
  (paVar15->mName).length = 0;
  (paVar15->mName).data[0] = '\0';
  memset((paVar15->mName).data + 1,0x1b,0x3ff);
  (paVar15->mPosition).x = 0.0;
  (paVar15->mPosition).y = 0.0;
  *(undefined8 *)&(paVar15->mPosition).z = 0;
  (paVar15->mUp).y = 1.0;
  (paVar15->mUp).z = 0.0;
  (paVar15->mLookAt).x = 0.0;
  (paVar15->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar15->mLookAt).z = 0x3f490fdb3f800000;
  paVar15->mClipPlaneNear = 0.1;
  paVar15->mClipPlaneFar = 1000.0;
  paVar15->mAspect = 0.0;
  this->pScene->mCameras[1] = paVar15;
  local_3a[0] = '\0';
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_60.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,char>(local_50,"0","check[0]",(int *)&local_60,local_3a);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void RemoveVCProcessTest::SetUp()
{
    // construct the process
    piProcess = new RemoveVCProcess();
    pScene = new aiScene();

    // fill the scene ..
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 2];
    pScene->mMeshes[0] = new aiMesh();
    pScene->mMeshes[1] = new aiMesh();

    pScene->mMeshes[0]->mNumVertices = 120;
    pScene->mMeshes[0]->mVertices = new aiVector3D[120];
    pScene->mMeshes[0]->mNormals = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[0] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[1] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[2] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[3] = new aiVector3D[120];

    pScene->mMeshes[1]->mNumVertices = 120;
    pScene->mMeshes[1]->mVertices = new aiVector3D[120];

    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations = 2];
    pScene->mAnimations[0] = new aiAnimation();
    pScene->mAnimations[1] = new aiAnimation();

    pScene->mTextures = new aiTexture*[pScene->mNumTextures = 2];
    pScene->mTextures[0] = new aiTexture();
    pScene->mTextures[1] = new aiTexture();

    pScene->mMaterials    = new aiMaterial*[pScene->mNumMaterials = 2];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mMaterials[1] = new aiMaterial();

    pScene->mLights    = new aiLight*[pScene->mNumLights = 2];
    pScene->mLights[0] = new aiLight();
    pScene->mLights[1] = new aiLight();

    pScene->mCameras    = new aiCamera*[pScene->mNumCameras = 2];
    pScene->mCameras[0] = new aiCamera();
    pScene->mCameras[1] = new aiCamera();

    // COMPILE TEST: aiMaterial may no add any extra members,
    // so we don't need a virtual destructor
    char check[sizeof(aiMaterial) == sizeof(aiMaterial) ? 10 : -1];
    check[0] = 0;
    // to remove compiler warning
    EXPECT_EQ( 0, check[0] );
}